

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_global_declarations
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> *local_68;
  undefined8 local_60;
  allocator<char> local_41;
  string local_40;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_20;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  local_20 = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  while( true ) {
    bVar1 = true;
    if ((((this->cur_token).type != TK_VAR) && (bVar1 = true, (this->cur_token).type != TK_FUNCTION)
        ) && (bVar1 = true, (this->cur_token).type != TK_CONST)) {
      bVar1 = (this->cur_token).type == TK_TYPE;
    }
    if (!bVar1) break;
    switch((this->cur_token).type) {
    case TK_VAR:
      parse_variable_declaration(this,local_20);
      break;
    case TK_CONST:
      parse_constant_declaration(this,local_20);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_41);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_78,"assertion: parse_global_declarations");
      local_60 = 1;
      args._M_len = 1;
      args._M_array = &local_78;
      local_68 = &local_78;
      this_local._7_1_ = append_syntax_error(this,&local_40,0x129,args);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
LAB_00145c43:
      return (bool)(this_local._7_1_ & 1);
    case TK_FUNCTION:
      parse_function_declaration(this,local_20);
      break;
    case TK_TYPE:
      parse_type_declaration(this,local_20);
    }
  }
  this_local._7_1_ = 1;
  goto LAB_00145c43;
}

Assistant:

bool ast::parse_global_declarations(std::unique_ptr<ast_node>& parent) {
    while (cur_token.type == tokenizer::TK_VAR ||
        cur_token.type == tokenizer::TK_FUNCTION ||
        cur_token.type == tokenizer::TK_CONST ||
        cur_token.type == tokenizer::TK_TYPE) {
        switch (cur_token.type) {
            case tokenizer::TK_VAR: parse_variable_declaration(parent); break;
            case tokenizer::TK_FUNCTION: parse_function_declaration(parent); break;
            case tokenizer::TK_CONST: parse_constant_declaration(parent); break;
            case tokenizer::TK_TYPE: parse_type_declaration(parent); break;
            default:
                return syntax_error({"assertion: parse_global_declarations"});
        }
    }

    return true;
}